

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall
cmState::SetCacheEntryProperty(cmState *this,string *key,string *propertyName,string *value)

{
  CacheIterator it;
  CacheIterator local_20;
  
  local_20 = cmCacheManager::GetCacheIterator
                       ((this->CacheManager)._M_t.
                        super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>
                        .super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl,
                        (key->_M_dataplus)._M_p);
  cmCacheManager::CacheIterator::SetProperty(&local_20,propertyName,(value->_M_dataplus)._M_p);
  return;
}

Assistant:

void cmState::SetCacheEntryProperty(std::string const& key,
                                    std::string const& propertyName,
                                    std::string const& value)
{
  cmCacheManager::CacheIterator it =
    this->CacheManager->GetCacheIterator(key.c_str());
  it.SetProperty(propertyName, value.c_str());
}